

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtins.c
# Opt level: O0

int do_insmod_inner(int nargs,char **args,int opt_len)

{
  char *pcVar1;
  char *pcVar2;
  long lVar3;
  int iVar4;
  undefined8 uStack_50;
  char acStack_48 [8];
  char *local_40;
  int local_34;
  ulong uStack_30;
  int i;
  unsigned_long __vla_expr0;
  int local_1c;
  char **ppcStack_18;
  int opt_len_local;
  char **args_local;
  int nargs_local;
  
  args_local._4_4_ = nargs;
  ppcStack_18 = args;
  local_1c = opt_len;
  __vla_expr0 = (unsigned_long)acStack_48;
  lVar3 = -((ulong)(opt_len + 1) + 0xf & 0xfffffffffffffff0);
  local_40 = acStack_48 + lVar3;
  uStack_30 = (ulong)(opt_len + 1);
  acStack_48[lVar3] = '\0';
  pcVar2 = local_40;
  if (2 < args_local._4_4_) {
    pcVar1 = ppcStack_18[2];
    *(undefined8 *)((long)&uStack_50 + lVar3) = 0x104c66;
    strcpy(pcVar2,pcVar1);
    for (local_34 = 3; pcVar2 = local_40, local_34 < args_local._4_4_; local_34 = local_34 + 1) {
      *(undefined8 *)((long)&uStack_50 + lVar3) = 0x104c85;
      strcat(pcVar2," ");
      pcVar1 = local_40;
      pcVar2 = ppcStack_18[local_34];
      *(undefined8 *)((long)&uStack_50 + lVar3) = 0x104c9a;
      strcat(pcVar1,pcVar2);
    }
  }
  *(undefined8 *)((long)&uStack_50 + lVar3) = 0x104cb8;
  iVar4 = insmod(*(char **)(&stack0xffffffffffffffc8 + lVar3),*(char **)((long)&local_40 + lVar3));
  return iVar4;
}

Assistant:

static int do_insmod_inner(int nargs, char **args, int opt_len)
{
    char options[opt_len + 1];
    int i;

    options[0] = '\0';
    if (nargs > 2) {
        strcpy(options, args[2]);
        for (i = 3; i < nargs; ++i) {
            strcat(options, " ");
            strcat(options, args[i]);
        }
    }

    return insmod(args[1], options);
}